

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.h
# Opt level: O1

void __thiscall CMU462::Ray::Ray(Ray *this,Vector3D *o,Vector3D *d,int depth)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  this->depth = (long)depth;
  (this->o).x = o->x;
  (this->o).y = o->y;
  (this->o).z = o->z;
  (this->d).x = d->x;
  (this->d).y = d->y;
  (this->d).z = d->z;
  this->min_t = 0.0;
  this->max_t = INFINITY;
  (this->inv_d).x = 0.0;
  (this->inv_d).y = 0.0;
  (this->inv_d).z = 0.0;
  dVar2 = 1.0 / d->x;
  dVar3 = 1.0 / d->y;
  dVar1 = 1.0 / d->z;
  (this->inv_d).x = dVar2;
  (this->inv_d).y = dVar3;
  (this->inv_d).z = dVar1;
  this->sign[0] = (uint)(dVar2 < 0.0);
  this->sign[1] = (uint)(dVar3 < 0.0);
  this->sign[2] = (uint)(dVar1 < 0.0);
  return;
}

Assistant:

Ray(const Vector3D& o, const Vector3D& d, int depth = 0)
      : o(o), d(d), min_t(0.0), max_t(INF_D), depth(depth) {
        inv_d = Vector3D(1 / d.x, 1 / d.y, 1 / d.z);
        sign[0] = (inv_d.x < 0);
        sign[1] = (inv_d.y < 0);
        sign[2] = (inv_d.z < 0);
      }